

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderReturnTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalReturnDynamic(ShaderEvalContext *c)

{
  float fVar1;
  float fVar2;
  long lVar3;
  float fVar4;
  float afStack_2c [3];
  uint local_20;
  float local_1c;
  int local_18 [6];
  
  afStack_2c[2] = (c->coords).m_data[0];
  fVar1 = (c->coords).m_data[1];
  fVar4 = afStack_2c[2] + fVar1;
  fVar2 = (c->coords).m_data[2];
  if (fVar4 < 0.0) {
    afStack_2c[2] = (c->coords).m_data[3];
  }
  local_1c = fVar1;
  if (fVar4 >= 0.0) {
    local_1c = fVar2;
  }
  local_20 = ~-(uint)(fVar4 < 0.0) & (uint)fVar1 | -(uint)(fVar4 < 0.0) & (uint)fVar2;
  local_18[2] = 0;
  local_18[3] = 1;
  local_18[4] = 2;
  lVar3 = 2;
  do {
    (c->color).m_data[local_18[lVar3]] = afStack_2c[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

inline void evalReturnDynamic	(ShaderEvalContext& c) { c.color.xyz() = (c.coords.x()+c.coords.y() >= 0.0f) ? c.coords.swizzle(0,1,2) : c.coords.swizzle(3,2,1); }